

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_b97.c
# Opt level: O3

void gga_xc_b97_init(xc_func_type *p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  
  pvVar3 = malloc(0x78);
  p->params = pvVar3;
  iVar2 = p->info->number;
  uVar1 = iVar2 - 0x197;
  if (((0x12 < uVar1) || ((0x7e0cbU >> (uVar1 & 0x1f) & 1) == 0)) && (iVar2 != 0x10a)) {
    return;
  }
  xc_hyb_init_hybrid(p,0.0);
  return;
}

Assistant:

static void
gga_xc_b97_init(xc_func_type *p)
{
  assert(p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_xc_b97_params));

  if(p->info->number == XC_HYB_GGA_XC_B97   ||
     p->info->number == XC_HYB_GGA_XC_B97_1 ||
     p->info->number == XC_HYB_GGA_XC_B97_2 ||
     p->info->number == XC_HYB_GGA_XC_B97_K ||
     p->info->number == XC_HYB_GGA_XC_B97_3 ||
     p->info->number == XC_HYB_GGA_XC_SB98_1A ||
     p->info->number == XC_HYB_GGA_XC_SB98_1B ||
     p->info->number == XC_HYB_GGA_XC_SB98_1C ||
     p->info->number == XC_HYB_GGA_XC_SB98_2A ||
     p->info->number == XC_HYB_GGA_XC_SB98_2B ||
     p->info->number == XC_HYB_GGA_XC_SB98_2C ||
     p->info->number == XC_HYB_GGA_XC_B97_1P){
    xc_hyb_init_hybrid(p, 0.0);
  }

}